

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::SourceCodeInfo_Location::Clear(SourceCodeInfo_Location *this)

{
  string *psVar1;
  uint uVar2;
  
  uVar2 = this->_has_bits_[0];
  if ((uVar2 & 0x3fc) != 0) {
    if (((uVar2 & 4) != 0) &&
       (psVar1 = this->leading_comments_, psVar1 != (string *)internal::kEmptyString_abi_cxx11_)) {
      psVar1->_M_string_length = 0;
      *(psVar1->_M_dataplus)._M_p = '\0';
      uVar2 = this->_has_bits_[0];
    }
    if (((uVar2 & 8) != 0) &&
       (psVar1 = this->trailing_comments_, psVar1 != (string *)internal::kEmptyString_abi_cxx11_)) {
      psVar1->_M_string_length = 0;
      *(psVar1->_M_dataplus)._M_p = '\0';
    }
  }
  (this->path_).current_size_ = 0;
  (this->span_).current_size_ = 0;
  this->_has_bits_[0] = 0;
  if ((this->_unknown_fields_).fields_ !=
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    UnknownFieldSet::ClearFallback(&this->_unknown_fields_);
    return;
  }
  return;
}

Assistant:

void SourceCodeInfo_Location::Clear() {
  if (_has_bits_[2 / 32] & (0xffu << (2 % 32))) {
    if (has_leading_comments()) {
      if (leading_comments_ != &::google::protobuf::internal::kEmptyString) {
        leading_comments_->clear();
      }
    }
    if (has_trailing_comments()) {
      if (trailing_comments_ != &::google::protobuf::internal::kEmptyString) {
        trailing_comments_->clear();
      }
    }
  }
  path_.Clear();
  span_.Clear();
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}